

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O1

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:451:36)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:451:36)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  float fVar2;
  Vec3f L;
  Vec3f D;
  undefined1 local_90 [16];
  pointer local_80;
  _Any_data local_78;
  pointer local_68;
  pointer ppStack_60;
  undefined8 local_58;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RStack_50;
  undefined1 local_48 [16];
  long local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)(local_90 + 0xc));
  ParseStream::getVec3f((ParseStream *)local_90);
  fVar2 = ParseStream::getFloat(this_00);
  local_28 = ZEXT416((uint)local_90._12_4_);
  local_58 = local_80;
  RStack_50.ptr =
       (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       0x0;
  local_48 = ZEXT416((uint)local_90._0_4_);
  local_38 = local_90._4_8_;
  uStack_30 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (pointer)0x0;
  ppStack_60 = (pointer)0x0;
  local_78._M_unused._M_object = operator_new(0x28);
  *(SceneLoadingTutorialApplication **)local_78._M_unused._0_8_ = pSVar1;
  *(undefined4 *)((long)local_78._M_unused._0_8_ + 8) = local_28._0_4_;
  *(undefined4 *)((long)local_78._M_unused._0_8_ + 0xc) = (undefined4)local_58;
  *(undefined4 *)((long)local_78._M_unused._0_8_ + 0x10) = local_58._4_4_;
  *(undefined4 *)((long)local_78._M_unused._0_8_ + 0x14) = local_48._0_4_;
  *(long *)((long)local_78._M_unused._0_8_ + 0x18) = local_38;
  *(float *)((long)local_78._M_unused._0_8_ + 0x20) = fVar2;
  ppStack_60 = (pointer)std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:455:27)>
                        ::_M_invoke;
  local_68 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:455:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)&local_78);
  if (local_68 != (pointer)0x0) {
    (*(code *)local_68)(&local_78,&local_78,3);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }